

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aeron.cpp
# Opt level: O3

ptr_t __thiscall aeron::Aeron::mapCncFile(Aeron *this,Context *context)

{
  char *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Aeron *pAVar4;
  size_type sVar5;
  int iVar6;
  int64_t iVar7;
  int *piVar8;
  long lVar9;
  uint8_t *puVar10;
  SourcedException *pSVar11;
  char *pcVar12;
  Context *in_RDX;
  MemoryMappedFile *__tmp;
  char *pcVar13;
  _Alloc_hider this_00;
  MemoryMappedFile *pMVar14;
  ptr_t pVar15;
  ManyToOneRingBuffer ringBuffer;
  AtomicBuffer toDriverBuffer;
  allocator local_f9;
  Context *local_f8;
  Aeron *local_f0;
  string local_e8;
  undefined1 local_c0 [32];
  int local_a0;
  long local_98;
  string local_90;
  string local_70;
  AtomicBuffer local_50;
  _func_int **local_38;
  
  local_f8 = in_RDX;
  local_98 = std::chrono::_V2::system_clock::now();
  local_98 = local_98 / 1000000;
  this->_vptr_Aeron = (_func_int **)0x0;
  (this->m_randomDevice).field_0.field_0._M_file = (void *)0x0;
  local_38 = (_func_int **)&PTR__AtomicBuffer_00163200;
  local_f0 = this;
LAB_001489e3:
  do {
    Context::cncFileName_abi_cxx11_((string *)local_c0,local_f8);
    iVar7 = util::MemoryMappedFile::getFileSize((char *)local_c0._0_8_);
    if ((AtomicBuffer *)local_c0._0_8_ != (AtomicBuffer *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_);
    }
    if (iVar7 < 1) {
      lVar9 = std::chrono::_V2::system_clock::now();
      if (local_f8->m_mediaDriverTimeout + local_98 < lVar9 / 1000000) {
        pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
        Context::cncFileName_abi_cxx11_(&local_e8,local_f8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,"CnC file not created: ",&local_e8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,"");
        pcVar13 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
        ;
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar12 = pcVar12 + 1;
          pcVar1 = pcVar13 + 1;
          pcVar13 = pcVar13 + 1;
        } while (*pcVar12 == *pcVar1);
        std::__cxx11::string::string
                  ((string *)&local_70,pcVar13 + (*pcVar1 == '/'),(allocator *)&local_50);
        util::SourcedException::SourcedException
                  (pSVar11,(string *)local_c0,&local_90,&local_70,0x69);
        *(undefined ***)pSVar11 = &PTR__SourcedException_001634e0;
        __cxa_throw(pSVar11,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      local_c0._0_8_ = (AtomicBuffer *)0x0;
      local_c0._8_8_ = 16000000;
      do {
        iVar6 = nanosleep((timespec *)local_c0,(timespec *)local_c0);
        if (iVar6 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      goto LAB_001489e3;
    }
    Context::cncFileName_abi_cxx11_((string *)local_c0,local_f8);
    util::MemoryMappedFile::mapExisting((MemoryMappedFile *)&local_e8,(char *)local_c0._0_8_);
    sVar5 = local_e8._M_string_length;
    this_00._M_p = local_e8._M_dataplus._M_p;
    pAVar4 = local_f0;
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_f0->_vptr_Aeron = (_func_int **)this_00._M_p;
    (local_f0->m_randomDevice).field_0.field_0._M_file = (void *)sVar5;
    if ((AtomicBuffer *)local_c0._0_8_ != (AtomicBuffer *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_);
      this_00._M_p = (pointer)pAVar4->_vptr_Aeron;
    }
LAB_00148a62:
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_f0->m_randomDevice).field_0.field_0._M_file;
    pMVar14 = (MemoryMappedFile *)this_00._M_p;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
        pMVar14 = (MemoryMappedFile *)local_f0->_vptr_Aeron;
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    piVar8 = (int *)util::MemoryMappedFile::getMemoryPtr((MemoryMappedFile *)this_00._M_p);
    util::MemoryMappedFile::getMemorySize((MemoryMappedFile *)this_00._M_p);
    iVar6 = *piVar8;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (iVar6 == 0) {
      lVar9 = std::chrono::_V2::system_clock::now();
      if (local_f8->m_mediaDriverTimeout + local_98 < lVar9 / 1000000) {
        pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
        Context::cncFileName_abi_cxx11_(&local_e8,local_f8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,"CnC file is created but not initialised: ",&local_e8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,"");
        pcVar13 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
        ;
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar12 = pcVar12 + 1;
          pcVar1 = pcVar13 + 1;
          pcVar13 = pcVar13 + 1;
        } while (*pcVar12 == *pcVar1);
        std::__cxx11::string::string
                  ((string *)&local_70,pcVar13 + (*pcVar1 == '/'),(allocator *)&local_50);
        util::SourcedException::SourcedException
                  (pSVar11,(string *)local_c0,&local_90,&local_70,0x78);
        *(undefined ***)pSVar11 = &PTR__SourcedException_001634e0;
        __cxa_throw(pSVar11,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      local_c0._0_8_ = (AtomicBuffer *)0x0;
      local_c0._8_8_ = 1000000;
      do {
        iVar6 = nanosleep((timespec *)local_c0,(timespec *)local_c0);
        this_00._M_p = (pointer)pMVar14;
        if (iVar6 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      goto LAB_00148a62;
    }
    if (iVar6 != 0xf) {
      pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_e8,iVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     "CnC file version not supported: ",&local_e8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",
                 "");
      pcVar13 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
      ;
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
      do {
        pcVar12 = pcVar12 + 1;
        pcVar1 = pcVar13 + 1;
        pcVar13 = pcVar13 + 1;
      } while (*pcVar12 == *pcVar1);
      std::__cxx11::string::string
                ((string *)&local_70,pcVar13 + (*pcVar1 == '/'),(allocator *)&local_50);
      util::SourcedException::SourcedException(pSVar11,(string *)local_c0,&local_90,&local_70,0x81);
      *(undefined ***)pSVar11 = &PTR__SourcedException_00163468;
      __cxa_throw(pSVar11,&util::IllegalStateException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    pMVar14 = (MemoryMappedFile *)local_f0->_vptr_Aeron;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_f0->m_randomDevice).field_0.field_0._M_file;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    puVar10 = util::MemoryMappedFile::getMemoryPtr(pMVar14);
    util::MemoryMappedFile::getMemorySize(pMVar14);
    local_50.m_buffer = util::MemoryMappedFile::getMemoryPtr(pMVar14);
    local_50.m_buffer = local_50.m_buffer + CncFileDescriptor::META_DATA_LENGTH;
    local_50.m_length = *(length_t *)(puVar10 + 4);
    local_50._vptr_AtomicBuffer = local_38;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    concurrent::ringbuffer::ManyToOneRingBuffer::ManyToOneRingBuffer
              ((ManyToOneRingBuffer *)local_c0,&local_50);
    lVar9 = *(long *)(*(uint8_t **)(local_c0._0_8_ + 8) + local_a0);
    while (lVar9 == 0) {
      lVar9 = std::chrono::_V2::system_clock::now();
      if (local_f8->m_mediaDriverTimeout + local_98 < lVar9 / 1000000) {
        pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"no driver heartbeat detected","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,"");
        pcVar13 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
        ;
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar12 = pcVar12 + 1;
          pcVar1 = pcVar13 + 1;
          pcVar13 = pcVar13 + 1;
        } while (*pcVar12 == *pcVar1);
        std::__cxx11::string::string((string *)&local_70,pcVar13 + (*pcVar1 == '/'),&local_f9);
        util::SourcedException::SourcedException(pSVar11,&local_e8,&local_90,&local_70,0x8b);
        *(undefined ***)pSVar11 = &PTR__SourcedException_001634e0;
        __cxa_throw(pSVar11,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      local_e8._M_string_length = 1000000;
      do {
        iVar6 = nanosleep((timespec *)&local_e8,(timespec *)&local_e8);
        if (iVar6 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      lVar9 = *(long *)(*(uint8_t **)(local_c0._0_8_ + 8) + local_a0);
    }
    lVar9 = std::chrono::_V2::system_clock::now();
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar9 / 1000000);
    if ((long)_Var3._M_pi - local_f8->m_mediaDriverTimeout <=
        *(long *)(*(uint8_t **)(local_c0._0_8_ + 8) + local_a0)) {
      pVar15.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      pVar15.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_f0;
      return (ptr_t)pVar15.
                    super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (local_f8->m_mediaDriverTimeout + local_98 < (long)_Var3._M_pi) {
      pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"no driver heartbeat detected","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",
                 "");
      pcVar13 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
      ;
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
      do {
        pcVar12 = pcVar12 + 1;
        pcVar1 = pcVar13 + 1;
        pcVar13 = pcVar13 + 1;
      } while (*pcVar12 == *pcVar1);
      std::__cxx11::string::string((string *)&local_70,pcVar13 + (*pcVar1 == '/'),&local_f9);
      util::SourcedException::SourcedException(pSVar11,&local_e8,&local_90,&local_70,0x96);
      *(undefined ***)pSVar11 = &PTR__SourcedException_001634e0;
      __cxa_throw(pSVar11,&util::DriverTimeoutException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_f0->m_randomDevice).field_0.field_0._M_file;
    local_f0->_vptr_Aeron = (_func_int **)0x0;
    (local_f0->m_randomDevice).field_0.field_0._M_file = (void *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 100000000;
    do {
      iVar6 = nanosleep((timespec *)&local_e8,(timespec *)&local_e8);
      if (iVar6 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
  } while( true );
}

Assistant:

inline MemoryMappedFile::ptr_t Aeron::mapCncFile(Context &context)
{
    const long long startMs = currentTimeMillis();
    MemoryMappedFile::ptr_t cncBuffer;

    while (true)
    {
        while (MemoryMappedFile::getFileSize(context.cncFileName().c_str()) <= 0)
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException("CnC file not created: " + context.cncFileName(), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_16);
        }

        cncBuffer = MemoryMappedFile::mapExisting(context.cncFileName().c_str());

        std::int32_t cncVersion = 0;

        while (0 == (cncVersion = CncFileDescriptor::cncVersionVolatile(cncBuffer)))
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(
                    "CnC file is created but not initialised: " + context.cncFileName(), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_1);
        }

        if (CncFileDescriptor::CNC_VERSION != cncVersion)
        {
            throw util::IllegalStateException(
                "CnC file version not supported: " + std::to_string(cncVersion), SOURCEINFO);
        }

        AtomicBuffer toDriverBuffer(CncFileDescriptor::createToDriverBuffer(cncBuffer));
        ManyToOneRingBuffer ringBuffer(toDriverBuffer);

        while (0 == ringBuffer.consumerHeartbeatTime())
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(std::string("no driver heartbeat detected"), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_1);
        }

        const long long timeMs = currentTimeMillis();
        if (ringBuffer.consumerHeartbeatTime() < (timeMs - context.m_mediaDriverTimeout))
        {
            if (timeMs > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(std::string("no driver heartbeat detected"), SOURCEINFO);
            }

            cncBuffer = nullptr;

            std::this_thread::sleep_for(IDLE_SLEEP_MS_100);
            continue;
        }

        break;
    }

    return cncBuffer;
}